

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O0

double __thiscall Gillespie::IndexUpdatePropensity(Gillespie *this,Ptr *reaction,int index)

{
  element_type *peVar1;
  reference pvVar2;
  double extraout_XMM0_Qa;
  double alpha_diff;
  int index_local;
  Ptr *reaction_local;
  Gillespie *this_local;
  
  peVar1 = std::__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      reaction);
  (**peVar1->_vptr_Reaction)();
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->alpha_list_,(long)index);
  *pvVar2 = extraout_XMM0_Qa + *pvVar2;
  return extraout_XMM0_Qa;
}

Assistant:

double Gillespie::IndexUpdatePropensity(Reaction::Ptr reaction, int index) {
  double alpha_diff = reaction->CalculatePropensity();
  alpha_list_[index] += alpha_diff;
 
  // alpha_sum_ += alpha_diff;
  return alpha_diff;
}